

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O3

Flag<AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>_>
* __thiscall
AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::
add<AutoArgParse::Flag,AutoArgParse::DoNothingTrigger>
          (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *this,string *flag,string *description
          ,DoNothingTrigger *trigger)

{
  int *piVar1;
  ComplexFlag<AutoArgParse::DoNothingTrigger> *pCVar2;
  _Map_pointer ppbVar3;
  type pFVar4;
  _Elt_pointer pbVar5;
  ExclusiveWrapper<AutoArgParse::DoNothingTrigger> local_20;
  
  local_20.parentGroup = this;
  pFVar4 = ComplexFlag<AutoArgParse::DoNothingTrigger>::
           add<AutoArgParse::Flag,AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>>
                     (this->parentFlag,flag,(this->super_FlagBase).super_ParseToken.policy,
                      description,&local_20);
  pCVar2 = this->parentFlag;
  pbVar5 = (pCVar2->store).flagInsertionOrder.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar5 == (pCVar2->store).flagInsertionOrder.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar5 = (pCVar2->store).flagInsertionOrder.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->flags,
             pbVar5 + -1);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->parentFlag->store).flagInsertionOrder);
  ppbVar3 = (this->flags).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (1 < ((long)(this->flags).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->flags).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)(this->flags).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->flags).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
          ((((ulong)((long)ppbVar3 -
                    (long)(this->flags).
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppbVar3 == (_Map_pointer)0x0)) * 0x10) {
    if ((this->super_FlagBase).super_ParseToken.policy == MANDATORY) {
      piVar1 = &(this->parentFlag->store)._numberMandatoryFlags;
      *piVar1 = *piVar1 + -1;
    }
    else {
      piVar1 = &(this->parentFlag->store)._numberOptionalFlags;
      *piVar1 = *piVar1 + -1;
    }
  }
  return pFVar4;
}

Assistant:

FlagType<ExclusiveWrapper<OnParseTriggerType>>& add(
        const std::string& flag, const std::string& description,
        OnParseTriggerType&& trigger = DoNothingTrigger()) {
        typedef ExclusiveWrapper<OnParseTriggerType> ExclusiveEnforcer;
        auto& flagObj = parentFlag.template add<FlagType>(
            flag, policy, description,
            ExclusiveEnforcer(this, std::forward<OnParseTriggerType>(trigger)));
        flags.push_back(std::move(parentFlag.store.flagInsertionOrder.back()));
        parentFlag.store.flagInsertionOrder.pop_back();
        if (flags.size() > 1) {
            if (policy == Policy::MANDATORY) {
                --parentFlag.store._numberMandatoryFlags;
            } else {
                --parentFlag.store._numberOptionalFlags;
            }
        }
        return flagObj;
    }